

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_event_loop.cpp
# Opt level: O3

void __thiscall timer::operator()(timer *this,error_code *e)

{
  uint uVar1;
  long lVar2;
  ptime *ppVar3;
  int iVar4;
  long *plVar5;
  canceler func;
  undefined1 auVar6 [12];
  ptime local_48;
  long local_38;
  int local_30;
  
  if (this->cancel == true) {
    if ((e->_M_cat != booster::aio::aio_error_cat) || (e->_M_value != 1)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "e==booster::system::error_code(booster::aio::aio_error::canceled,booster::aio::aio_error_cat)"
                 ,0x5d);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
      plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x5d);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      std::ostream::put((char)plVar5);
      std::ostream::flush();
      return_code = 1;
    }
    booster::aio::io_service::stop();
    timer_done = true;
  }
  else {
    if (e->_M_value != 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"!e",2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
      plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cerr,0x62);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      std::ostream::put((char)plVar5);
      std::ostream::flush();
      return_code = 1;
    }
    auVar6 = booster::ptime::now();
    lVar2 = (this->t).sec;
    if ((auVar6._0_8_ < lVar2) || ((auVar6._0_8_ <= lVar2 && (auVar6._8_4_ < (this->t).nsec)))) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Fail: ",6);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"booster::ptime::now() >= t",0x1a);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," at ",4);
      plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cerr,99);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      std::ostream::put((char)plVar5);
      std::ostream::flush();
      return_code = 1;
    }
    this->cancel = true;
    ppVar3 = (ptime *)this->srv;
    auVar6 = booster::ptime::now();
    local_48.sec = 10;
    local_48.nsec = 0;
    booster::ptime::normalize(&local_48);
    local_48.sec = auVar6._0_8_ + local_48.sec;
    local_48.nsec = auVar6._8_4_ + local_48.nsec;
    booster::ptime::normalize(&local_48);
    local_38 = local_48.sec;
    local_30 = local_48.nsec;
    booster::callback<void_(const_std::error_code_&)>::callback<timer>
              ((callback<void_(const_std::error_code_&)> *)&local_48,*this);
    iVar4 = booster::aio::io_service::set_timer_event(ppVar3,(callback *)&local_38);
    this->event_id = iVar4;
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)&local_48);
    uVar1 = this->event_id;
    ppVar3 = (ptime *)this->srv;
    auVar6 = booster::ptime::now();
    local_48.sec = 0;
    local_48.nsec = 100000000;
    booster::ptime::normalize(&local_48);
    local_48.sec = auVar6._0_8_ + local_48.sec;
    local_48.nsec = auVar6._8_4_ + local_48.nsec;
    booster::ptime::normalize(&local_48);
    local_38 = local_48.sec;
    local_30 = local_48.nsec;
    func._4_4_ = 0;
    func.event_id = uVar1;
    func.srv = (io_service *)ppVar3;
    booster::callback<void_(const_std::error_code_&)>::callback<timer::canceler>
              ((callback<void_(const_std::error_code_&)> *)&local_48,func);
    booster::aio::io_service::set_timer_event(ppVar3,(callback *)&local_38);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
              ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)&local_48);
  }
  return;
}

Assistant:

void operator()(booster::system::error_code const &e)
	{
		if(cancel) {
			TEST(e==booster::system::error_code(booster::aio::aio_error::canceled,booster::aio::aio_error_cat));
			srv->stop();
			timer_done = true;
		}
		else {
			TEST(!e);
			TEST(booster::ptime::now() >= t);
			cancel=true;
			event_id = srv->set_timer_event(booster::ptime::now() + ptime::seconds(10),*this);
			canceler c = {event_id,srv};
			srv->set_timer_event(booster::ptime::now() + ptime::milliseconds(100),c);
		}

	}